

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmuuidgen.cpp
# Opt level: O0

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  int iVar1;
  int local_24;
  int i;
  char **argv_local;
  int argc_local;
  CommandOptions *this_local;
  
  this->error_flag = true;
  this->no_newline_flag = false;
  this->c_array_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  local_24 = 1;
  do {
    if (argc <= local_24) {
      if (((this->help_flag & 1U) == 0) && ((this->version_flag & 1U) == 0)) {
        this->error_flag = false;
      }
      return;
    }
    iVar1 = strcmp(argv[local_24],"-help");
    if (iVar1 == 0) {
      this->help_flag = true;
    }
    else {
      if (((*argv[local_24] != '-') || (iVar1 = isalpha((int)argv[local_24][1]), iVar1 == 0)) ||
         (argv[local_24][2] != '\0')) {
        fprintf(_stderr,"Unrecognized option: %s\n",argv[local_24]);
        return;
      }
      switch(argv[local_24][1]) {
      case 'V':
        this->version_flag = true;
        break;
      default:
        fprintf(_stderr,"Unrecognized option: %s\n",argv[local_24]);
        return;
      case 'c':
        this->c_array_flag = true;
        break;
      case 'h':
        this->help_flag = true;
        break;
      case 'n':
        this->no_newline_flag = true;
        break;
      case 'v':
        this->verbose_flag = true;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), no_newline_flag(false), c_array_flag(false), version_flag(false),
    help_flag(false), verbose_flag(false)
  {
    for ( int i = 1; i < argc; i++ )
      {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
     
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'c': c_array_flag = true; break;
	      case 'n': no_newline_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'V': version_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
	    return;
	  }
      }

    if ( help_flag || version_flag )
      return;
    
    error_flag = false;
  }